

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O0

void prf_nodeinfo_exit(void)

{
  int iVar1;
  int count;
  int i;
  int local_4;
  
  iVar1 = prf_array_count((void *)0x1059ed);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (nodetypes[local_4] != (prf_nodeinfo_t *)0x0) {
      free(nodetypes[local_4]->name);
      free(nodetypes[local_4]);
    }
  }
  prf_array_free((void *)0x105a5d);
  nodetypes = (prf_nodeinfo_t **)0x0;
  return;
}

Assistant:

void
prf_nodeinfo_exit(
    void )
{
    int i, count;
    count = prf_array_count(nodetypes);
    for ( i = 0; i < count; i++ ) {
        if ( nodetypes[i] != NULL ) {
            free(nodetypes[i]->name);
            free(nodetypes[i]);
        }
    }
    prf_array_free(nodetypes);
    nodetypes = NULL;
}